

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O3

void __thiscall miniros::RPCManager::~RPCManager(RPCManager *this)

{
  pointer pCVar1;
  pointer pcVar2;
  int in_EDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int in_ESI;
  
  shutdown(this,in_ESI,in_EDX);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
  ::~_Rb_tree(&(this->functions_)._M_t);
  std::
  _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::~_Rb_tree(&(this->connections_)._M_t);
  std::
  _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::~_Rb_tree(&(this->removed_connections_)._M_t);
  std::
  _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::~_Rb_tree(&(this->added_connections_)._M_t);
  pCVar1 = (this->clients_).
           super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->clients_).
                                 super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  XmlRpc::XmlRpcServer::~XmlRpcServer(&this->server_);
  if ((this->server_thread_)._M_id._M_thread == 0) {
    pcVar2 = (this->uri_)._M_dataplus._M_p;
    paVar3 = &(this->uri_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar3) {
      operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
      return;
    }
    return;
  }
  std::terminate();
}

Assistant:

RPCManager::~RPCManager()
{
  shutdown();
}